

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcStatesPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,int *states1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  float *pfVar12;
  float *pfVar13;
  long lVar14;
  float *pfVar15;
  ulong uVar16;
  float *pfVar17;
  float *pfVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int local_a8;
  int local_a4;
  long local_a0;
  float *local_98;
  
  iVar1 = this->kCategoryCount;
  if (0 < (long)iVar1) {
    uVar2 = this->kStateCount;
    uVar8 = uVar2 + 3;
    if (-1 < (int)uVar2) {
      uVar8 = uVar2;
    }
    uVar9 = uVar2 + 1;
    iVar3 = this->kPartialsPaddedStateCount;
    iVar4 = this->kPatternCount;
    iVar5 = this->kMatrixSize;
    local_a4 = iVar3 * startPattern;
    pfVar13 = matrices2 + 2;
    local_a0 = 0;
    local_a8 = 0;
    local_98 = matrices2;
    do {
      if (startPattern < endPattern) {
        pfVar12 = partials2 + local_a4;
        pfVar18 = destP + (iVar4 * (int)local_a0 + startPattern) * iVar3;
        lVar14 = (long)startPattern;
        do {
          if (0 < (int)uVar2) {
            iVar6 = states1[lVar14];
            uVar11 = 0;
            lVar10 = (long)local_a8;
            pfVar15 = local_98;
            pfVar17 = pfVar13;
            do {
              if ((int)uVar2 < 4) {
                uVar16 = 0;
                auVar19 = ZEXT816(0);
              }
              else {
                auVar19 = ZEXT816(0);
                uVar16 = 0;
                do {
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = *(ulong *)(pfVar17 + (uVar16 - 2));
                  auVar23._8_8_ = 0;
                  auVar23._0_8_ = *(ulong *)(pfVar17 + uVar16);
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ = *(ulong *)(pfVar12 + uVar16);
                  auVar19 = vfmadd213ps_fma(auVar24,auVar21,auVar19);
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = *(ulong *)(pfVar12 + uVar16 + 2);
                  auVar19 = vfmadd213ps_fma(auVar20,auVar23,auVar19);
                  uVar16 = uVar16 + 4;
                } while ((long)uVar16 < (long)(int)(uVar8 & 0xfffffffc));
              }
              auVar22 = ZEXT1664(auVar19);
              if ((int)uVar16 < (int)uVar2) {
                uVar16 = uVar16 & 0xffffffff;
                do {
                  auVar20 = vfmadd231ss_fma(auVar22._0_16_,ZEXT416((uint)pfVar15[uVar16]),
                                            ZEXT416((uint)pfVar12[uVar16]));
                  auVar22 = ZEXT1664(auVar20);
                  uVar16 = uVar16 + 1;
                } while (uVar2 != uVar16);
              }
              auVar19 = vmovshdup_avx(auVar19);
              lVar7 = iVar6 + lVar10;
              lVar10 = lVar10 + (int)uVar9;
              *pfVar18 = (auVar19._0_4_ + auVar22._0_4_) * matrices1[lVar7];
              pfVar18 = pfVar18 + 1;
              uVar11 = uVar11 + 1;
              pfVar17 = pfVar17 + uVar9;
              pfVar15 = pfVar15 + uVar9;
            } while (uVar11 != uVar2);
          }
          lVar14 = lVar14 + 1;
          pfVar12 = pfVar12 + iVar3;
        } while (lVar14 != endPattern);
      }
      local_a0 = local_a0 + 1;
      local_a8 = local_a8 + iVar5;
      local_a4 = local_a4 + iVar4 * iVar3;
      pfVar13 = pfVar13 + iVar5;
      local_98 = local_98 + iVar5;
    } while (local_a0 != iVar1);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesPartials(REALTYPE* destP,
                                                           const int* states1,
                                                           const REALTYPE* matrices1,
                                                           const REALTYPE* partials2,
                                                           const REALTYPE* matrices2,
                                                           int startPattern,
                                                           int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;


    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state1 = states1[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE tmp = matrices1[w + state1];
                REALTYPE sumA = 0.0;
                REALTYPE sumB = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sumA += matrices2Ptr[j + 0] * partials2Ptr[j + 0];
                    sumB += matrices2Ptr[j + 1] * partials2Ptr[j + 1];
                    sumA += matrices2Ptr[j + 2] * partials2Ptr[j + 2];
                    sumB += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }
                for (; j < kStateCount; j++) {
                    sumA += matrices2Ptr[j] * partials2Ptr[j];
                }

                w += matrixIncr;

                *(destPtr++) = tmp * (sumA + sumB);
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPtr++) = 0.0;
                }
            }
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}